

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall
DnsStats::SubmitPacket
          (DnsStats *this,uint8_t *packet,uint32_t length,int ip_type,uint8_t *ip_header,
          my_bpftimeval ts)

{
  size_t source_addr_length;
  bool bVar1;
  
  bVar1 = ip_type == 4;
  source_addr_length = 0x10;
  if (bVar1) {
    source_addr_length = 4;
  }
  SubmitPacket(this,packet,length,ip_header + (ulong)bVar1 * 4 + 8,source_addr_length,
               ip_header + (ulong)!bVar1 * 8 + 0x10,source_addr_length,ts);
  return;
}

Assistant:

void DnsStats::SubmitPacket(uint8_t * packet, uint32_t length, int ip_type, uint8_t* ip_header,
    my_bpftimeval ts)
{
    uint8_t * source_addr;
    size_t source_addr_length;
    uint8_t * dest_addr;
    size_t dest_addr_length;

    GetSourceAddress(ip_type, ip_header, &source_addr, &source_addr_length);
    GetDestAddress(ip_type, ip_header, &dest_addr, &dest_addr_length);

    SubmitPacket(packet, length, source_addr, source_addr_length,
        dest_addr, dest_addr_length, ts);
}